

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

QMetaEnum metaEnumFromType(QMetaType t)

{
  QByteArrayView bv;
  bool bVar1;
  QMetaObject *pQVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  qsizetype lastColon;
  QMetaObject *metaObject;
  QByteArray enumName;
  QByteArrayView qflagsNamePrefix;
  undefined4 in_stack_fffffffffffffed8;
  TypeFlag in_stack_fffffffffffffedc;
  undefined7 in_stack_fffffffffffffee0;
  char in_stack_fffffffffffffee7;
  QByteArray *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QMetaObject *in_stack_fffffffffffffef8;
  QByteArray *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  QByteArray *in_stack_ffffffffffffff10;
  QByteArrayView local_38;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_28;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_24;
  QMetaType local_20;
  QMetaEnum local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super_QFlagsStorage<QMetaType::TypeFlag>.i =
       (QFlagsStorage<QMetaType::TypeFlag>)
       QMetaType::flags((QMetaType *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  local_24.super_QFlagsStorage<QMetaType::TypeFlag>.i =
       (QFlagsStorage<QMetaType::TypeFlag>)
       QFlags<QMetaType::TypeFlag>::operator&
                 ((QFlags<QMetaType::TypeFlag> *)
                  CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                  in_stack_fffffffffffffedc);
  bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_24);
  if ((bVar1) &&
     (pQVar2 = QMetaType::metaObject
                         ((QMetaType *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0)
                         ), pQVar2 != (QMetaObject *)0x0)) {
    local_38.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<8ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (char (*) [8])in_stack_fffffffffffffee8);
    QMetaType::name(&local_20);
    QByteArray::QByteArray
              (in_stack_ffffffffffffff10,
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (qsizetype)in_stack_ffffffffffffff00);
    bVar1 = QByteArray::endsWith
                      ((QByteArray *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                       (char)(in_stack_fffffffffffffedc >> 0x18));
    if ((bVar1) &&
       (bv.m_data._0_4_ = in_stack_ffffffffffffff08,
       bv.m_size = (qsizetype)in_stack_ffffffffffffff00, bv.m_data._4_4_ = in_stack_ffffffffffffff0c
       , bVar1 = QByteArray::startsWith(in_stack_fffffffffffffee8,bv), bVar1)) {
      QByteArray::chop((QByteArray *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QByteArrayView::size(&local_38);
      QByteArray::sliced(in_stack_ffffffffffffff00,(qsizetype)in_stack_fffffffffffffef8);
      QByteArray::operator=
                ((QByteArray *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QByteArray::~QByteArray((QByteArray *)0x3a54e3);
    }
    qVar3 = QByteArray::lastIndexOf
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee7,
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (qVar3 != -1) {
      QByteArray::sliced(in_stack_ffffffffffffff00,(qsizetype)in_stack_fffffffffffffef8);
      QByteArray::operator=
                ((QByteArray *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QByteArray::~QByteArray((QByteArray *)0x3a557f);
    }
    QByteArray::operator_cast_to_char_((QByteArray *)0x3a559e);
    QMetaObject::indexOfEnumerator
              ((QMetaObject *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (char *)in_stack_fffffffffffffef8);
    local_18 = QMetaObject::enumerator(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    QByteArray::~QByteArray((QByteArray *)0x3a55fb);
  }
  else {
    QMetaEnum::QMetaEnum(&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

static QMetaEnum metaEnumFromType(QMetaType t)
{
    if (t.flags() & QMetaType::IsEnumeration) {
        if (const QMetaObject *metaObject = t.metaObject()) {
            QByteArrayView qflagsNamePrefix = "QFlags<";
            QByteArray enumName = t.name();
            if (enumName.endsWith('>') && enumName.startsWith(qflagsNamePrefix)) {
                // extract the template argument
                enumName.chop(1);
                enumName = enumName.sliced(qflagsNamePrefix.size());
            }
            if (qsizetype lastColon = enumName.lastIndexOf(':'); lastColon != -1)
                enumName = enumName.sliced(lastColon + 1);
            return metaObject->enumerator(metaObject->indexOfEnumerator(enumName));
        }
    }
    return QMetaEnum();
}